

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O3

Token __thiscall slang::syntax::SyntaxNode::getLastToken(SyntaxNode *this)

{
  size_t sVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar3;
  ConstGetChildVisitor *in_RCX;
  unsigned_long *in_R8;
  ulong uVar4;
  Token TVar5;
  ConstTokenOrSyntax child;
  Token local_40;
  variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_30;
  undefined1 auVar6 [14];
  Info *pIVar7;
  
  sVar1 = getChildCount(this);
  if (0 < (long)sVar1) {
    uVar4 = sVar1 + 1;
    do {
      detail::
      visitSyntaxNode<slang::syntax::SyntaxNode_const,(anonymous_namespace)::ConstGetChildVisitor,unsigned_long&>
                ((ConstTokenOrSyntax *)&local_30,(detail *)this,(SyntaxNode *)(uVar4 - 2),in_RCX,
                 in_R8);
      if (local_30.super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          _M_index == '\0') {
        pvVar3 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(&local_30);
        if (pvVar3->info != (Info *)0x0) {
          pvVar3 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(&local_30);
          TVar5.kind = pvVar3->kind;
          auVar6[2] = pvVar3->field_0x2;
          auVar6[3] = (pvVar3->numFlags).raw;
          auVar6._4_4_ = pvVar3->rawLen;
          register0x00000010 = pvVar3->info;
          return TVar5;
        }
      }
      else {
        ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(&local_30);
        if (*ppSVar2 != (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
          ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(&local_30);
          local_40 = getLastToken(*ppSVar2);
          if (local_40.info != (Info *)0x0) {
            return local_40;
          }
        }
      }
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  parsing::Token::Token(&local_40);
  return local_40;
}

Assistant:

parsing::Token SyntaxNode::getLastToken() const {
    size_t childCount = getChildCount();
    for (ptrdiff_t i = ptrdiff_t(childCount) - 1; i >= 0; i--) {
        auto child = getChild(size_t(i));
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getLastToken();
            if (result)
                return result;
        }
    }
    return Token();
}